

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenLoad(BinaryenModuleRef module,uint32_t bytes,bool signed_,uint32_t offset,uint32_t align,
            BinaryenType type,BinaryenExpressionRef ptr,char *memoryName)

{
  Load *pLVar1;
  string_view sVar2;
  
  if (align == 0) {
    align = bytes;
  }
  sVar2 = (string_view)getMemoryName(module,memoryName);
  pLVar1 = MixedArena::alloc<wasm::Load>(&module->allocator);
  pLVar1->isAtomic = false;
  pLVar1->bytes = (uint8_t)bytes;
  pLVar1->signed_ = signed_;
  (pLVar1->offset).addr = (ulong)offset;
  (pLVar1->align).addr = (ulong)align;
  pLVar1->ptr = ptr;
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = type;
  (pLVar1->memory).super_IString.str = sVar2;
  return (BinaryenExpressionRef)pLVar1;
}

Assistant:

BinaryenExpressionRef BinaryenLoad(BinaryenModuleRef module,
                                   uint32_t bytes,
                                   bool signed_,
                                   uint32_t offset,
                                   uint32_t align,
                                   BinaryenType type,
                                   BinaryenExpressionRef ptr,
                                   const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeLoad(bytes,
                !!signed_,
                offset,
                align ? align : bytes,
                (Expression*)ptr,
                Type(type),
                getMemoryName(module, memoryName)));
}